

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleIndexVertexArray.h
# Opt level: O0

void __thiscall
btTriangleIndexVertexArray::addIndexedMesh
          (btTriangleIndexVertexArray *this,btIndexedMesh *mesh,PHY_ScalarType indexType)

{
  int iVar1;
  btIndexedMesh *pbVar2;
  PHY_ScalarType in_EDX;
  btAlignedObjectArray<btIndexedMesh> *in_RSI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  btAlignedObjectArray<btIndexedMesh>::push_back
            (in_RSI,(btIndexedMesh *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  iVar1 = btAlignedObjectArray<btIndexedMesh>::size
                    ((btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 0x18));
  pbVar2 = btAlignedObjectArray<btIndexedMesh>::operator[]
                     ((btAlignedObjectArray<btIndexedMesh> *)(in_RDI + 0x18),iVar1 + -1);
  pbVar2->m_indexType = in_EDX;
  return;
}

Assistant:

void	addIndexedMesh(const btIndexedMesh& mesh, PHY_ScalarType indexType = PHY_INTEGER)
	{
		m_indexedMeshes.push_back(mesh);
		m_indexedMeshes[m_indexedMeshes.size()-1].m_indexType = indexType;
	}